

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  parasail_result_t *ppVar5;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong size;
  size_t size_00;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int *__s;
  int a;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int local_a8;
  int local_9c;
  ulong local_80;
  int *local_58;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  local_80 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_table_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_scan_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    uVar13 = (ulong)(uint)_s1Len;
    if (_s1Len < 1) {
      parasail_sg_flags_table_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    uVar13 = (ulong)(uint)matrix->length;
  }
  a = (int)uVar13;
  ppVar5 = parasail_result_new_table1(a,s2Len);
  if (ppVar5 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar5->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar5->flag | 0x1420202;
  size = (ulong)(uint)s2Len;
  ptr = parasail_memalign_int(0x10,size);
  uVar3 = a + 1;
  ptr_00 = parasail_memalign_int(0x10,(long)(int)uVar3);
  size_00 = (size_t)a;
  ptr_01 = parasail_memalign_int(0x10,size_00);
  ptr_02 = parasail_memalign_int(0x10,(long)(int)uVar3);
  auVar14._0_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
  auVar14._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
  auVar14._8_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0 && (int)ptr_01 == 0);
  auVar14._12_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
  iVar4 = movmskps((int)ptr_02,auVar14);
  if (iVar4 != 0) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    local_58 = parasail_memalign_int(0x10,size_00);
    if (local_58 == (int *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < a) {
      piVar1 = matrix->mapper;
      uVar7 = 0;
      do {
        local_58[uVar7] = piVar1[(byte)_s1[uVar7]];
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
  }
  else {
    local_58 = (int *)0x0;
  }
  __s = ptr_00 + 1;
  piVar1 = matrix->mapper;
  uVar7 = 0;
  do {
    ptr[uVar7] = piVar1[(byte)_s2[uVar7]];
    uVar7 = uVar7 + 1;
  } while (size != uVar7);
  *ptr_00 = 0;
  *ptr_02 = 0;
  auVar14 = _DAT_00903aa0;
  if (s1_beg == 0) {
    if (a < 1) goto LAB_00555540;
    lVar9 = uVar13 - 1;
    auVar15._8_4_ = (int)lVar9;
    auVar15._0_8_ = lVar9;
    auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
    iVar4 = -open;
    lVar9 = 0;
    auVar15 = auVar15 ^ _DAT_00903aa0;
    auVar20 = _DAT_00903a90;
    do {
      auVar19 = auVar20 ^ auVar14;
      if ((bool)(~(auVar19._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar19._0_4_ ||
                  auVar15._4_4_ < auVar19._4_4_) & 1)) {
        *(int *)((long)ptr_00 + lVar9 + 4) = iVar4;
      }
      if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
          auVar19._12_4_ <= auVar15._12_4_) {
        *(int *)((long)ptr_00 + lVar9 + 8) = iVar4 - gap;
      }
      lVar17 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar17 + 2;
      lVar9 = lVar9 + 8;
      iVar4 = iVar4 + gap * -2;
    } while ((ulong)(uVar3 >> 1) << 3 != lVar9);
LAB_00555436:
    auVar14 = _DAT_00903aa0;
    lVar9 = uVar13 - 1;
    auVar16._8_4_ = (int)lVar9;
    auVar16._0_8_ = lVar9;
    auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar7 = 0;
    auVar16 = auVar16 ^ _DAT_00903aa0;
    auVar19 = _DAT_00903a80;
    auVar18 = _DAT_00903a90;
    do {
      auVar20 = auVar18 ^ auVar14;
      iVar4 = auVar16._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar4 && auVar16._0_4_ < auVar20._0_4_ || iVar4 < auVar20._4_4_)
                & 1)) {
        ptr_01[uVar7] = -0x40000000;
      }
      if ((auVar20._12_4_ != auVar16._12_4_ || auVar20._8_4_ <= auVar16._8_4_) &&
          auVar20._12_4_ <= auVar16._12_4_) {
        ptr_01[uVar7 + 1] = -0x40000000;
      }
      auVar20 = auVar19 ^ auVar14;
      iVar8 = auVar20._4_4_;
      if (iVar8 <= iVar4 && (iVar8 != iVar4 || auVar20._0_4_ <= auVar16._0_4_)) {
        ptr_01[uVar7 + 2] = -0x40000000;
        ptr_01[uVar7 + 3] = -0x40000000;
      }
      uVar7 = uVar7 + 4;
      lVar9 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar9 + 4;
      lVar9 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar9 + 4;
    } while ((a + 3U & 0xfffffffc) != uVar7);
    bVar2 = true;
  }
  else {
    if (0 < a) {
      memset(__s,0,uVar13 * 4);
      goto LAB_00555436;
    }
LAB_00555540:
    bVar2 = false;
  }
  uVar3 = s2Len - 1;
  local_9c = a;
  if (s2Len == 1) {
    local_80 = 1;
    local_a8 = -0x40000000;
  }
  else {
    uVar7 = 1;
    if (1 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    local_a8 = -0x40000000;
    uVar10 = 0;
    do {
      if (bVar2) {
        uVar6 = 0;
        do {
          iVar4 = __s[uVar6] - open;
          if (__s[uVar6] - open < ptr_01[uVar6] - gap) {
            iVar4 = ptr_01[uVar6] - gap;
          }
          ptr_01[uVar6] = iVar4;
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
        if (!bVar2) goto LAB_0055584d;
        piVar1 = matrix->matrix;
        uVar6 = 0;
        do {
          if (matrix->type == 0) {
            iVar4 = local_58[uVar6];
          }
          else {
            iVar4 = (int)uVar6;
          }
          iVar4 = ptr_00[uVar6] + piVar1[(long)(matrix->size * iVar4) + (long)ptr[uVar10]];
          if (iVar4 <= ptr_01[uVar6]) {
            iVar4 = ptr_01[uVar6];
          }
          ptr_02[uVar6 + 1] = iVar4;
          uVar6 = uVar6 + 1;
        } while (uVar13 != uVar6);
        iVar4 = -((int)uVar10 * gap + open);
        if (s2_beg != 0) {
          iVar4 = 0;
        }
        *ptr_02 = iVar4;
        if (bVar2) {
          iVar8 = -0x40000000;
          uVar12 = 0;
          uVar6 = uVar10;
          do {
            iVar8 = iVar8 - gap;
            if (iVar8 < ptr_02[uVar12]) {
              iVar8 = ptr_02[uVar12];
            }
            iVar11 = iVar8 - open;
            if (iVar8 - open < ptr_02[uVar12 + 1]) {
              iVar11 = ptr_02[uVar12 + 1];
            }
            __s[uVar12] = iVar11;
            ((ppVar5->field_4).rowcols)->score_row[uVar6] = iVar11;
            uVar12 = uVar12 + 1;
            uVar6 = uVar6 + size;
          } while (uVar13 != uVar12);
        }
      }
      else {
LAB_0055584d:
        iVar4 = -((int)uVar10 * gap + open);
        if (s2_beg != 0) {
          iVar4 = 0;
        }
        *ptr_02 = iVar4;
      }
      *ptr_00 = iVar4;
      if ((s2_end != 0) && (local_a8 < __s[a + -1])) {
        local_80 = uVar10 & 0xffffffff;
        local_9c = a + -1;
        local_a8 = __s[a + -1];
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar7);
  }
  if (bVar2) {
    uVar7 = 0;
    do {
      iVar4 = __s[uVar7] - open;
      if (__s[uVar7] - open < ptr_01[uVar7] - gap) {
        iVar4 = ptr_01[uVar7] - gap;
      }
      ptr_01[uVar7] = iVar4;
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
    if (bVar2) {
      piVar1 = matrix->matrix;
      uVar7 = 0;
      do {
        if (matrix->type == 0) {
          iVar4 = local_58[uVar7];
        }
        else {
          iVar4 = (int)uVar7;
        }
        iVar4 = ptr_00[uVar7] + piVar1[(long)(matrix->size * iVar4) + (long)ptr[uVar3]];
        if (iVar4 <= ptr_01[uVar7]) {
          iVar4 = ptr_01[uVar7];
        }
        ptr_02[uVar7 + 1] = iVar4;
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
      iVar4 = 0;
      if (s2_beg == 0) {
        iVar4 = -(uVar3 * gap + open);
      }
      *ptr_02 = iVar4;
      if (bVar2) {
        lVar9 = (long)(int)uVar3;
        iVar4 = -0x40000000;
        uVar7 = 0;
        do {
          iVar4 = iVar4 - gap;
          if (iVar4 < ptr_02[uVar7]) {
            iVar4 = ptr_02[uVar7];
          }
          iVar8 = iVar4 - open;
          if (iVar4 - open < ptr_02[uVar7 + 1]) {
            iVar8 = ptr_02[uVar7 + 1];
          }
          __s[uVar7] = iVar8;
          ((ppVar5->field_4).rowcols)->score_row[lVar9] = iVar8;
          if ((s1_end != 0) && (local_a8 < __s[uVar7])) {
            local_9c = (int)uVar7;
            local_80 = (ulong)uVar3;
            local_a8 = __s[uVar7];
          }
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + size;
        } while (uVar13 != uVar7);
      }
      goto LAB_005556be;
    }
  }
  iVar4 = 0;
  if (s2_beg == 0) {
    iVar4 = -(gap * uVar3 + open);
  }
  *ptr_02 = iVar4;
LAB_005556be:
  if ((s2_end != 0) && (local_a8 < ptr_00[size_00])) {
    local_9c = a + -1;
    local_80._0_4_ = uVar3;
    local_a8 = ptr_00[size_00];
  }
  if (s2_end == 0 && s1_end == 0) {
    local_9c = a + -1;
    local_a8 = ptr_00[size_00];
    local_80._0_4_ = uVar3;
  }
  ppVar5->score = local_a8;
  ppVar5->end_query = local_9c;
  ppVar5->end_ref = (uint)local_80;
  parasail_free(ptr_02);
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(local_58);
    return ppVar5;
  }
  return ppVar5;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            E[i] = MAX(E[i]-gap, H[i]-open);
        }
        /* calculate Ht */
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            Ht[i] = MAX(H[i-1]+matval, E[i]);
        }
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            H[i] = MAX(Ht[i], Ft_opn);
#ifdef PARASAIL_TABLE
            result->tables->score_table[i*s2Len + j] = H[i];
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_col[i] = H[i];
#endif
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_row[j] = H[s1Len-1];
#endif
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}